

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
ReadLinearExpr<ExprPrinter::LinearPartHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
           *this,int num_terms,LinearPartHandler linear_expr)

{
  undefined8 in_RCX;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter> *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  LinearPartHandler *unaff_retaddr;
  double coef;
  int var_index;
  int i;
  BinaryReader<mp::internal::EndiannessConverter> *in_stack_ffffffffffffffd0;
  undefined4 local_20;
  undefined8 *puVar1;
  
  puVar1 = in_RDI;
  for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
    ReadUInt(in_RDX,(uint)((ulong)puVar1 >> 0x20));
    in_stack_ffffffffffffffd0 =
         (BinaryReader<mp::internal::EndiannessConverter> *)
         BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(in_stack_ffffffffffffffd0);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    ExprPrinter::LinearPartHandler::AddTerm
              (unaff_retaddr,(int)((ulong)in_RCX >> 0x20),(double)in_RDX);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}